

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O2

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  char **p;
  size_t *len;
  la_int64_t *plVar1;
  ulong uVar2;
  uint uVar3;
  mode_t mVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  archive_string_conv *sc;
  char *pcVar9;
  size_t sVar10;
  archive_string *paVar11;
  int *piVar12;
  char *pcVar13;
  archive_entry *paVar14;
  la_int64_t lVar15;
  char tartype;
  size_t sVar16;
  int local_25c;
  char buff [512];
  
  plVar1 = (la_int64_t *)a->format_data;
  sc = (archive_string_conv *)plVar1[10];
  if (sc == (archive_string_conv *)0x0) {
    if ((int)plVar1[0xc] == 0) {
      sc = archive_string_default_conversion_for_write((archive_conflict *)a);
      plVar1[0xb] = (la_int64_t)sc;
      *(undefined4 *)(plVar1 + 0xc) = 1;
    }
    else {
      sc = (archive_string_conv *)plVar1[0xb];
    }
  }
  pcVar9 = archive_entry_hardlink(entry);
  if (((pcVar9 != (char *)0x0) || (pcVar9 = archive_entry_symlink(entry), pcVar9 != (char *)0x0)) ||
     (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar4 = archive_entry_filetype(entry);
  if (((mVar4 == 0x4000) && (pcVar9 = archive_entry_pathname(entry), pcVar9 != (char *)0x0)) &&
     ((*pcVar9 != '\0' && (sVar10 = strlen(pcVar9), pcVar9[sVar10 - 1] != '/')))) {
    buff[0] = '\0';
    buff[1] = '\0';
    buff[2] = '\0';
    buff[3] = '\0';
    buff[4] = '\0';
    buff[5] = '\0';
    buff[6] = '\0';
    buff[7] = '\0';
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    buff[0x10] = '\0';
    buff[0x11] = '\0';
    buff[0x12] = '\0';
    buff[0x13] = '\0';
    buff[0x14] = '\0';
    buff[0x15] = '\0';
    buff[0x16] = '\0';
    buff[0x17] = '\0';
    sVar10 = strlen(pcVar9);
    paVar11 = archive_string_ensure((archive_string *)buff,sVar10 + 2);
    if (paVar11 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
      archive_string_free((archive_string *)buff);
      return -0x1e;
    }
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    archive_strncat((archive_string *)buff,pcVar9,sVar10);
    archive_strappend_char((archive_string *)buff,'/');
    archive_entry_copy_pathname(entry,(char *)buff._0_8_);
    archive_string_free((archive_string *)buff);
  }
  wVar5 = _archive_entry_pathname_l(entry,(char **)(plVar1 + 4),(size_t *)(plVar1 + 5),sc);
  if (wVar5 == L'\0') {
    local_25c = 0;
LAB_002613a3:
    wVar5 = _archive_entry_uname_l(entry,(char **)(plVar1 + 6),(size_t *)(plVar1 + 7),sc);
    if (wVar5 != L'\0') {
      piVar12 = __errno_location();
      if (*piVar12 == 0xc) {
        pcVar9 = "Can\'t allocate memory for Uname";
        goto LAB_002614fc;
      }
      pcVar9 = archive_entry_uname(entry);
      pcVar13 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to %s",pcVar9,pcVar13);
      local_25c = -0x14;
    }
    wVar5 = _archive_entry_gname_l(entry,(char **)(plVar1 + 8),(size_t *)(plVar1 + 9),sc);
    if (wVar5 != L'\0') {
      piVar12 = __errno_location();
      if (*piVar12 == 0xc) {
        pcVar9 = "Can\'t allocate memory for Gname";
        goto LAB_002614fc;
      }
      pcVar9 = archive_entry_gname(entry);
      pcVar13 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to %s",pcVar9,pcVar13);
      local_25c = -0x14;
    }
    p = (char **)(plVar1 + 2);
    len = (size_t *)(plVar1 + 3);
    wVar5 = _archive_entry_hardlink_l(entry,p,len,sc);
    if (wVar5 == L'\0') {
LAB_002614be:
      sVar16 = *len;
      if (sVar16 == 0) {
        wVar5 = _archive_entry_symlink_l(entry,p,len,sc);
        if (wVar5 != L'\0') {
          piVar12 = __errno_location();
          if (*piVar12 == 0xc) goto LAB_002614f5;
          pcVar9 = archive_entry_hardlink(entry);
          pcVar13 = archive_string_conversion_charset_name(sc);
          archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar13
                           );
          local_25c = -0x14;
        }
        sVar16 = *len;
      }
      if (100 < sVar16) {
        paVar14 = archive_entry_new2((archive_conflict *)a);
        archive_entry_set_uname(paVar14,"root");
        archive_entry_set_gname(paVar14,"wheel");
        archive_entry_set_pathname(paVar14,"././@LongLink");
        archive_entry_set_size(paVar14,sVar16 + 1);
        iVar6 = archive_format_gnutar_header(a,buff,paVar14,'K');
        archive_entry_free(paVar14);
        if (((iVar6 < -0x14) || (iVar6 = __archive_write_output(a,buff,0x200), iVar6 < -0x14)) ||
           ((iVar6 = __archive_write_output(a,*p,sVar16 + 1), iVar6 < -0x14 ||
            (iVar6 = __archive_write_nulls(a,(ulong)(~(uint)sVar16 & 0x1ff)), iVar6 < -0x14))))
        goto LAB_0026150d;
      }
      uVar2 = plVar1[5];
      if (100 < uVar2) {
        pcVar9 = (char *)plVar1[4];
        paVar14 = archive_entry_new2((archive_conflict *)a);
        archive_entry_set_uname(paVar14,"root");
        archive_entry_set_gname(paVar14,"wheel");
        archive_entry_set_pathname(paVar14,"././@LongLink");
        archive_entry_set_size(paVar14,uVar2 + 1);
        iVar6 = archive_format_gnutar_header(a,buff,paVar14,'L');
        archive_entry_free(paVar14);
        if ((((iVar6 < -0x14) || (iVar6 = __archive_write_output(a,buff,0x200), iVar6 < -0x14)) ||
            (iVar6 = __archive_write_output(a,pcVar9,uVar2 + 1), iVar6 < -0x14)) ||
           (iVar6 = __archive_write_nulls(a,(ulong)(~(uint)uVar2 & 0x1ff)), iVar6 < -0x14))
        goto LAB_0026150d;
      }
      wVar5 = archive_entry_hardlink_is_set(entry);
      tartype = '1';
      if (wVar5 == L'\0') {
        mVar4 = archive_entry_filetype(entry);
        uVar3 = mVar4 - 0x1000 >> 0xc;
        uVar8 = mVar4 << 0x14 | uVar3;
        if ((9 < uVar8) || ((0x2abU >> (uVar3 & 0x1f) & 1) == 0)) {
          __archive_write_entry_filetype_unsupported(&a->archive,entry,"gnutar");
          iVar6 = -0x19;
          goto LAB_0026150d;
        }
        tartype = "6305040002"[uVar8];
      }
      iVar7 = archive_format_gnutar_header(a,buff,entry,tartype);
      iVar6 = iVar7;
      if ((-0x15 < iVar7) && (iVar6 = __archive_write_output(a,buff,0x200), -0x15 < iVar6)) {
        if (local_25c < iVar7) {
          iVar7 = local_25c;
        }
        if (iVar6 < iVar7) {
          iVar7 = iVar6;
        }
        lVar15 = archive_entry_size(entry);
        *plVar1 = lVar15;
        plVar1[1] = (ulong)(-(int)lVar15 & 0x1ff);
        iVar6 = iVar7;
      }
      goto LAB_0026150d;
    }
    piVar12 = __errno_location();
    if (*piVar12 != 0xc) {
      pcVar9 = archive_entry_hardlink(entry);
      pcVar13 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar13);
      local_25c = -0x14;
      goto LAB_002614be;
    }
LAB_002614f5:
    pcVar9 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar12 = __errno_location();
    if (*piVar12 != 0xc) {
      pcVar9 = archive_entry_pathname(entry);
      pcVar13 = archive_string_conversion_charset_name(sc);
      local_25c = -0x14;
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar9,pcVar13);
      goto LAB_002613a3;
    }
    pcVar9 = "Can\'t allocate memory for pathname";
  }
LAB_002614fc:
  archive_set_error(&a->archive,0xc,pcVar9);
  iVar6 = -0x1e;
LAB_0026150d:
  archive_entry_free((archive_entry *)0x0);
  return iVar6;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	char tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for pathname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t length = gnutar->linkname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write name and trailing null byte. */
		ret = __archive_write_output(a, gnutar->linkname, length);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to 512 bytes */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t length = gnutar->pathname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write pathname + trailing null byte. */
		ret = __archive_write_output(a, pathname, length);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to multiple of 512 bytes. */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink_is_set(entry)) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		default: /* AE_IFSOCK and unknown */
			__archive_write_entry_filetype_unsupported(
                            &a->archive, entry, "gnutar");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	archive_entry_free(entry_main);
	return (ret);
}